

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

void celero::DoNotOptimizeAway<void>(function<void_()> *x)

{
  bool bVar1;
  int iVar2;
  function<void_()> *p;
  id local_18;
  function<void_()> *local_10;
  function<void_()> *x_local;
  
  local_10 = x;
  std::function<void_()>::operator()(x);
  if (DoNotOptimizeAway<void>(std::function<void()>&&)::ttid == '\0') {
    iVar2 = __cxa_guard_acquire(&DoNotOptimizeAway<void>(std::function<void()>&&)::ttid);
    if (iVar2 != 0) {
      DoNotOptimizeAway<void>::ttid = std::this_thread::get_id();
      __cxa_guard_release(&DoNotOptimizeAway<void>(std::function<void()>&&)::ttid);
    }
  }
  local_18._M_thread = DoNotOptimizeAway<void>::ttid._M_thread;
  std::thread::id::id((id *)&p);
  bVar1 = std::operator==(local_18,(id)p);
  if (!bVar1) {
    return;
  }
  putchar((int)(char)*local_10);
  abort();
}

Assistant:

void celero::DoNotOptimizeAway(std::function<void(void)>&& x)
{
	x();

	// We must always do this test, but it will never pass.
	static auto ttid = std::this_thread::get_id();
	if(ttid == std::thread::id())
	{
		// This forces the value to never be optimized away
		// by taking a reference then using it.
		const auto* p = &x;
		putchar(*reinterpret_cast<const char*>(p));

		// If we do get here, kick out because something has gone wrong.
		std::abort();
	}
}